

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O2

RenderDeviceGLImpl * __thiscall
Diligent::
DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>::
GetDevice(DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
          *this)

{
  RenderDeviceGLImpl *pRVar1;
  char (*in_RCX) [10];
  string msg;
  string local_30;
  
  pRVar1 = this->m_pDevice;
  if (pRVar1 == (RenderDeviceGLImpl *)0x0) {
    FormatString<char[26],char[10]>
              (&local_30,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pDevice",in_RCX)
    ;
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetDevice",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
               ,0xbc);
    std::__cxx11::string::~string((string *)&local_30);
    pRVar1 = this->m_pDevice;
  }
  return pRVar1;
}

Assistant:

RenderDeviceImplType* GetDevice() const
    {
        VERIFY_EXPR(m_pDevice);
        return m_pDevice;
    }